

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void lj_err_optype_call(lua_State *L,TValue *o)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  
  uVar1 = *(uint *)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x1c);
  if ((uVar1 & 3) == 0) {
    lj_err_optype(L,o,LJ_ERR_OPCALL);
  }
  uVar2 = (o->field_2).it;
  uVar4 = 0xd;
  if ((0xfffeffff < uVar2) && (uVar4 = 3, (uVar2 & 0xffff8000) != 0xffff0000)) {
    uVar4 = (ulong)~uVar2;
  }
  pcVar3 = lj_obj_itypename[uVar4];
  (o->field_2).it = uVar1;
  (o->u32).lo = (uint32_t)L;
  L->base = o + 1;
  L->top = o + 1;
  err_msgv(L,LJ_ERR_BADCALL,pcVar3);
}

Assistant:

LJ_NOINLINE void lj_err_optype_call(lua_State *L, TValue *o)
{
  /* Gross hack if lua_[p]call or pcall/xpcall fail for a non-callable object:
  ** L->base still points to the caller. So add a dummy frame with L instead
  ** of a function. See lua_getstack().
  */
  const BCIns *pc = cframe_Lpc(L);
  if (((ptrdiff_t)pc & FRAME_TYPE) != FRAME_LUA) {
    const char *tname = lj_typename(o);
    setframe_pc(o, pc);
    setframe_gc(o, obj2gco(L));
    L->top = L->base = o+1;
    err_msgv(L, LJ_ERR_BADCALL, tname);
  }
  lj_err_optype(L, o, LJ_ERR_OPCALL);
}